

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O1

void dic_forEach(dictionary *dic,enumFunc f,void *user)

{
  int iVar1;
  long lVar2;
  keynode *k;
  keynode *pkVar3;
  
  if (0 < dic->length) {
    lVar2 = 0;
    do {
      for (pkVar3 = dic->table[lVar2]; pkVar3 != (keynode *)0x0; pkVar3 = pkVar3->next) {
        iVar1 = (*f)(pkVar3->key,(int)pkVar3->len,&pkVar3->value,user);
        if (iVar1 == 0) {
          return;
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < dic->length);
  }
  return;
}

Assistant:

void dic_forEach(struct dictionary* dic, enumFunc f, void *user) {
	for (int i = 0; i < dic->length; i++) {
		if (dic->table[i] != 0) {
			struct keynode *k = dic->table[i];
			while (k) {
				if (!f(k->key, k->len, &k->value, user)) return;
				k = k->next;
			}
		}
	}
}